

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O1

void __thiscall
ElfRelocator::loadRelocation
          (ElfRelocator *this,Elf32_Rela *rela,bool addend,ByteArray *data,int offset,
          Endianness endianness)

{
  Elf32_Addr EVar1;
  Elf32_Word EVar2;
  int iVar3;
  undefined7 in_register_00000011;
  
  EVar1 = ByteArray::getDoubleWord(data,(long)offset,endianness);
  rela->r_offset = EVar1;
  EVar2 = ByteArray::getDoubleWord(data,(long)(offset + 4),endianness);
  rela->r_info = EVar2;
  iVar3 = 0;
  if ((int)CONCAT71(in_register_00000011,addend) != 0) {
    iVar3 = ByteArray::getDoubleWord(data,(long)(offset + 8),endianness);
  }
  rela->r_addend = iVar3;
  return;
}

Assistant:

void ElfRelocator::loadRelocation(Elf32_Rela& rela, bool addend, ByteArray& data, int offset, Endianness endianness)
{
	rela.r_offset = data.getDoubleWord(offset + 0x00, endianness);
	rela.r_info   = data.getDoubleWord(offset + 0x04, endianness);
	if (addend)
		rela.r_addend = data.getDoubleWord(offset + 0x08, endianness);
	else
		rela.r_addend = 0;
}